

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

void tcu::fillWithComponentGradients(PixelBufferAccess *access,Vec4 *minVal,Vec4 *maxVal)

{
  bool bVar1;
  int iVar2;
  TextureFormat *pTVar3;
  bool local_9a;
  bool local_99;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  PixelBufferAccess local_78;
  PixelBufferAccess local_50;
  bool local_22;
  bool local_21;
  bool hasStencil;
  Vec4 *pVStack_20;
  bool hasDepth;
  Vec4 *maxVal_local;
  Vec4 *minVal_local;
  PixelBufferAccess *access_local;
  
  pVStack_20 = maxVal;
  maxVal_local = minVal;
  minVal_local = (Vec4 *)access;
  pTVar3 = ConstPixelBufferAccess::getFormat(&access->super_ConstPixelBufferAccess);
  bVar1 = isCombinedDepthStencilType(pTVar3->type);
  if (bVar1) {
    pTVar3 = ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)minVal_local);
    local_99 = true;
    if (pTVar3->order != DS) {
      pTVar3 = ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)minVal_local);
      local_99 = pTVar3->order == D;
    }
    local_21 = local_99;
    pTVar3 = ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)minVal_local);
    local_9a = true;
    if (pTVar3->order != DS) {
      pTVar3 = ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)minVal_local);
      local_9a = pTVar3->order == S;
    }
    local_22 = local_9a;
    if ((local_21 & 1U) != 0) {
      getEffectiveDepthStencilAccess(&local_50,(PixelBufferAccess *)minVal_local,MODE_DEPTH);
      fillWithComponentGradients(&local_50,maxVal_local,pVStack_20);
    }
    if ((local_22 & 1U) != 0) {
      getEffectiveDepthStencilAccess(&local_78,(PixelBufferAccess *)minVal_local,MODE_STENCIL);
      Vector<float,_4>::swizzle(&local_88,(int)maxVal_local,3,2,1);
      Vector<float,_4>::swizzle(&local_98,(int)pVStack_20,3,2,1);
      fillWithComponentGradients(&local_78,&local_88,&local_98);
    }
  }
  else {
    iVar2 = ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)minVal_local);
    if ((iVar2 == 1) &&
       (iVar2 = ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)minVal_local), iVar2 == 1
       )) {
      fillWithComponentGradients1D((PixelBufferAccess *)minVal_local,maxVal_local,pVStack_20);
    }
    else {
      iVar2 = ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)minVal_local);
      if (iVar2 == 1) {
        fillWithComponentGradients2D((PixelBufferAccess *)minVal_local,maxVal_local,pVStack_20);
      }
      else {
        fillWithComponentGradients3D((PixelBufferAccess *)minVal_local,maxVal_local,pVStack_20);
      }
    }
  }
  return;
}

Assistant:

void fillWithComponentGradients (const PixelBufferAccess& access, const Vec4& minVal, const Vec4& maxVal)
{
	if (isCombinedDepthStencilType(access.getFormat().type))
	{
		const bool hasDepth		= access.getFormat().order == tcu::TextureFormat::DS || access.getFormat().order == tcu::TextureFormat::D;
		const bool hasStencil	= access.getFormat().order == tcu::TextureFormat::DS || access.getFormat().order == tcu::TextureFormat::S;

		DE_ASSERT(hasDepth || hasStencil);

		// For combined formats, treat D and S as separate channels
		if (hasDepth)
			fillWithComponentGradients(getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_DEPTH), minVal, maxVal);
		if (hasStencil)
			fillWithComponentGradients(getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_STENCIL), minVal.swizzle(3,2,1,0), maxVal.swizzle(3,2,1,0));
	}
	else
	{
		if (access.getHeight() == 1 && access.getDepth() == 1)
			fillWithComponentGradients1D(access, minVal, maxVal);
		else if (access.getDepth() == 1)
			fillWithComponentGradients2D(access, minVal, maxVal);
		else
			fillWithComponentGradients3D(access, minVal, maxVal);
	}
}